

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2point_vector_layer.cc
# Opt level: O1

void __thiscall
s2builderutil::S2PointVectorLayer::S2PointVectorLayer
          (S2PointVectorLayer *this,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *points,
          LabelSetIds *label_set_ids,IdSetLexicon *label_set_lexicon,Options *options)

{
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Layer_002c14f8;
  this->points_ = points;
  this->label_set_ids_ = label_set_ids;
  this->label_set_lexicon_ = label_set_lexicon;
  *(undefined4 *)&this->options_ = *(undefined4 *)options;
  return;
}

Assistant:

S2PointVectorLayer::S2PointVectorLayer(vector<S2Point>* points,
                                       LabelSetIds* label_set_ids,
                                       IdSetLexicon* label_set_lexicon,
                                       const Options& options)
    : points_(points),
      label_set_ids_(label_set_ids),
      label_set_lexicon_(label_set_lexicon),
      options_(options) {}